

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * sx_EOL_LF(char *dest,int dest_sz,char *src)

{
  char local_29;
  char ch;
  char *end;
  char *src_local;
  char *pcStack_10;
  int dest_sz_local;
  char *dest_local;
  
  if (0 < dest_sz) {
    local_29 = *src;
    end = src + 1;
    pcStack_10 = dest;
    while (local_29 != '\0' && pcStack_10 < dest + (long)dest_sz + -1) {
      if (local_29 != '\r') {
        *pcStack_10 = local_29;
        pcStack_10 = pcStack_10 + 1;
      }
      local_29 = *end;
      end = end + 1;
    }
    *pcStack_10 = '\0';
    return pcStack_10;
  }
  __assert_fail("dest_sz > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",0x26f,
                "char *sx_EOL_LF(char *, int, const char *)");
}

Assistant:

char* sx_EOL_LF(char* dest, int dest_sz, const char* src)
{
    assert(dest_sz > 0);
    char* end = dest + dest_sz - 1;
    for (char ch = *src++; ch != '\0' && dest < end; ch = *src++) {
        if ('\r' != ch)
            *dest++ = ch;
    }
    *dest = '\0';
    return dest;
}